

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O0

void __thiscall
TempBanIRCCommand::trigger
          (TempBanIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  string_view name_00;
  string_view channel_00;
  string_view name_01;
  string_view channel_01;
  Server *pSVar1;
  TempBanIRCCommand *pTVar2;
  size_t sVar3;
  char *pcVar4;
  bool bVar5;
  const_pointer begin;
  const_pointer pvVar6;
  size_type sVar7;
  rep rVar8;
  duration<long,_std::ratio<1L,_1L>_> *pdVar9;
  char *pcVar10;
  basic_string_view<char,_std::char_traits<char>_> *in_whitespace;
  undefined1 auVar11 [8];
  basic_string_view<char,_std::char_traits<char>_> bVar12;
  __sv_type _Var13;
  size_t local_248;
  char *local_240;
  size_t local_200;
  char *local_1f8;
  allocator<char> local_1d9;
  undefined1 local_1d8 [8];
  string banner;
  char *local_1b0;
  size_t local_1a8;
  char *local_1a0;
  size_t local_188;
  char *local_180;
  duration<long,_std::ratio<1L,_1L>_> local_138;
  basic_string_view<char,_std::char_traits<char>_> local_130;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_120;
  duration_from_string_result<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> local_100;
  basic_string_view<char,_std::char_traits<char>_> *local_f0;
  size_t local_e8;
  char *local_e0;
  char *local_d8;
  undefined1 local_d0 [8];
  player_search_result search_result;
  string_view reason;
  string_view name;
  size_t local_90;
  char *local_88;
  undefined1 local_80 [8];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  command_split;
  seconds duration;
  char *local_50;
  IRC_Bot *source_local;
  TempBanIRCCommand *this_local;
  string_view nick_local;
  string_view channel_local;
  
  nick_local._M_len = (size_t)nick._M_str;
  this_local = (TempBanIRCCommand *)nick._M_len;
  pcVar10 = channel._M_str;
  nick_local._M_str = (char *)channel._M_len;
  bVar5 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&parameters);
  sVar3 = nick_local._M_len;
  pTVar2 = this_local;
  if (bVar5) {
    bVar12 = sv("Error: Too Few Parameters. Syntax: TempBan [Duration] <Player> [Reason]",0x47);
    duration.__r = bVar12._M_len;
    local_50 = bVar12._M_str;
    Jupiter::IRC::Client::sendNotice(source,pTVar2,sVar3,duration.__r,local_50);
  }
  else {
    command_split.second._M_str = (char *)RenX_CommandsPlugin::getDefaultTBanTime(&pluginInstance);
    local_90 = parameters._M_len;
    local_88 = parameters._M_str;
    in_whitespace = (basic_string_view<char,_std::char_traits<char>_> *)parameters._M_len;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&name._M_str," \t");
    jessilib::
    word_split_once_view<,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
              ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                *)local_80,(jessilib *)&local_90,
               (basic_string_view<char,_std::char_traits<char>_> *)&name._M_str,in_whitespace);
    reason._M_str = (char *)local_80;
    name._M_len = command_split.first._M_len;
    search_result.player = (PlayerInfo *)command_split.first._M_str;
    reason._M_len = command_split.second._M_len;
    local_e0 = nick_local._M_str;
    local_f0 = (basic_string_view<char,_std::char_traits<char>_> *)local_80;
    local_e8 = command_split.first._M_len;
    channel_01._M_str = pcVar10;
    channel_01._M_len = (size_t)nick_local._M_str;
    name_01._M_str = (char *)command_split.first._M_len;
    name_01._M_len = (size_t)local_80;
    auVar11 = local_80;
    local_d8 = pcVar10;
    _local_d0 = findPlayerByPartName(source,channel_01,name_01);
    if (((local_d0 != (undefined1  [8])0x0) && (search_result.server == (Server *)0x0)) &&
       (bVar5 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           &command_split.first._M_str), !bVar5)) {
      begin = std::basic_string_view<char,_std::char_traits<char>_>::data
                        ((basic_string_view<char,_std::char_traits<char>_> *)&reason._M_str);
      pvVar6 = std::basic_string_view<char,_std::char_traits<char>_>::data
                         ((basic_string_view<char,_std::char_traits<char>_> *)&reason._M_str);
      sVar7 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)&reason._M_str);
      local_100 = jessilib::duration_from_string<std::chrono::duration<long,std::ratio<1l,1l>>>
                            (begin,pvVar6 + sVar7);
      command_split.second._M_str = (char *)local_100.duration.__r;
      rVar8 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count
                        ((duration<long,_std::ratio<1L,_1L>_> *)&command_split.second._M_str);
      if (0 < rVar8) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_130," \t");
        jessilib::
        word_split_once_view<,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
                  (&local_120,(jessilib *)&command_split.first._M_str,&local_130,
                   (basic_string_view<char,_std::char_traits<char>_> *)auVar11);
        std::
        pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
        ::operator=((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                     *)local_80,&local_120);
        local_138.__r = (rep)RenX_CommandsPlugin::getMaxTBanTime(&pluginInstance);
        pdVar9 = std::min<std::chrono::duration<long,std::ratio<1l,1l>>>
                           ((duration<long,_std::ratio<1L,_1L>_> *)&command_split.second._M_str,
                            &local_138);
        command_split.second._M_str = (char *)pdVar9->__r;
        reason._M_str = (char *)local_80;
        name._M_len = command_split.first._M_len;
        search_result.player = (PlayerInfo *)command_split.first._M_str;
        reason._M_len = command_split.second._M_len;
        channel_00._M_str = pcVar10;
        channel_00._M_len = (size_t)nick_local._M_str;
        name_00._M_str = (char *)command_split.first._M_len;
        name_00._M_len = (size_t)local_80;
        _local_d0 = findPlayerByPartName(source,channel_00,name_00);
      }
    }
    pcVar4 = nick_local._M_str;
    if (local_d0 == (undefined1  [8])0x0) {
      bVar12 = sv("Error: Channel not attached to any connected Renegade X servers.",0x40);
      local_188 = bVar12._M_len;
      local_180 = bVar12._M_str;
      Jupiter::IRC::Client::sendMessage(source,pcVar4,pcVar10,local_188,local_180);
    }
    else if (search_result.server == (Server *)0x0) {
      bVar12 = sv("Error: Could not find player.",0x1d);
      local_1a8 = bVar12._M_len;
      local_1a0 = bVar12._M_str;
      Jupiter::IRC::Client::sendMessage(source,pcVar4,pcVar10,local_1a8,local_1a0);
    }
    else {
      bVar5 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                        ((basic_string_view<char,_std::char_traits<char>_> *)&search_result.player);
      if (bVar5) {
        join_0x00000010_0x00000000_ = sv("No reason",9);
        search_result.player = (PlayerInfo *)banner.field_2._8_8_;
        reason._M_len = (size_t)local_1b0;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)local_1d8,(basic_string_view<char,_std::char_traits<char>_> *)&this_local
                 ,&local_1d9);
      std::allocator<char>::~allocator(&local_1d9);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8,
                 "@IRC");
      auVar11 = local_d0;
      pSVar1 = search_result.server;
      _Var13 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_1d8);
      local_200 = _Var13._M_len;
      local_1f8 = _Var13._M_str;
      RenX::Server::banPlayer
                (auVar11,pSVar1,local_200,local_1f8,search_result.player,reason._M_len,
                 command_split.second._M_str);
      pcVar4 = nick_local._M_str;
      bVar12 = sv("Player banned.",0xe);
      local_248 = bVar12._M_len;
      local_240 = bVar12._M_str;
      Jupiter::IRC::Client::sendMessage(source,pcVar4,pcVar10,local_248,local_240);
      std::__cxx11::string::~string((string *)local_1d8);
    }
  }
  return;
}

Assistant:

void TempBanIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters) {
	if (parameters.empty()) {
		source->sendNotice(nick, "Error: Too Few Parameters. Syntax: TempBan [Duration] <Player> [Reason]"sv);
		return;
	}

	std::chrono::seconds duration = pluginInstance.getDefaultTBanTime();
	auto command_split = jessilib::word_split_once_view(std::string_view{parameters}, WHITESPACE_SV);
	std::string_view name = command_split.first;
	std::string_view reason = command_split.second;

	// Try searching by name first
	auto search_result = findPlayerByPartName(source, channel, name);
	if (search_result.server != nullptr
		&& search_result.player == nullptr
		&& !command_split.second.empty()) {
		// Try reading token as a duration instead, and search the name token if duration > 0
		duration = jessilib::duration_from_string(name.data(), name.data() + name.size()).duration;
		if (duration.count() > 0) {
			// It reads as a duration; sanity check & try searching again
			command_split = jessilib::word_split_once_view(command_split.second, WHITESPACE_SV);
			duration = std::min(duration, pluginInstance.getMaxTBanTime());
			name = command_split.first;
			reason = command_split.second;
			search_result = findPlayerByPartName(source, channel, name);
		}
	}

	if (search_result.server == nullptr) {
		source->sendMessage(channel, "Error: Channel not attached to any connected Renegade X servers."sv);
		return;
	}

	if (search_result.player == nullptr) {
		source->sendMessage(channel, "Error: Could not find player."sv);
		return;
	}

	if (reason.empty()) {
		reason = "No reason"sv;
	}

	std::string banner{ nick };
	banner += "@IRC";
	search_result.server->banPlayer(*search_result.player, banner, reason, duration);
	source->sendMessage(channel, "Player banned."sv);
}